

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::Client::Client(Client *this,char *host,int port,time_t timeout_sec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  uint uVar3;
  pointer pcVar4;
  uint __val;
  undefined8 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  this->_vptr_Client = (_func_int **)&PTR__Client_0016f260;
  std::__cxx11::string::string((string *)&this->host_,host,(allocator *)&local_70);
  this->port_ = port;
  this->timeout_sec_ = timeout_sec;
  pcVar4 = (this->host_)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + (this->host_)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  uVar3 = this->port_;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0014325a;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0014325a;
      }
      if (uVar8 < 10000) goto LAB_0014325a;
      uVar9 = uVar9 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0014325a:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50),__len,__val);
  uVar9 = 0xf;
  if (local_70 != local_60) {
    uVar9 = local_60[0];
  }
  if (uVar9 < (ulong)(local_48 + local_68)) {
    uVar9 = 0xf;
    if (local_50 != local_40) {
      uVar9 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar9) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_001432e6;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_001432e6:
  paVar1 = &(this->host_and_port_).field_2;
  (this->host_and_port_)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar2) {
    uVar5 = puVar7[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->host_and_port_).field_2 + 8) = uVar5;
  }
  else {
    (this->host_and_port_)._M_dataplus._M_p = (pointer)*puVar7;
    (this->host_and_port_).field_2._M_allocated_capacity = *psVar2;
  }
  (this->host_and_port_)._M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

inline Client::Client(
    const char* host, int port, time_t timeout_sec)
    : host_(host)
    , port_(port)
    , timeout_sec_(timeout_sec)
    , host_and_port_(host_ + ":" + std::to_string(port_))
{
}